

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LodRenderer.cpp
# Opt level: O2

void __thiscall
LodRenderer::removeDecoration(LodRenderer *this,repr coords,uint tileIndex,Drawable *drawable)

{
  iterator __position;
  iterator __position_00;
  uint local_34;
  repr local_30;
  
  local_34 = tileIndex;
  local_30 = coords;
  __position = FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
               ::find(&this->decorations_,&local_30);
  __position_00 =
       FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::find
                 (&(__position._M_current)->second,&local_34);
  if ((__position_00._M_current)->second == drawable) {
    std::
    vector<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
    ::erase(&((__position._M_current)->second).vec_,(const_iterator)__position_00._M_current);
    if (((__position._M_current)->second).vec_.
        super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        ((__position._M_current)->second).vec_.
        super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
      ::erase(&(this->decorations_).vec_,(const_iterator)__position._M_current);
    }
  }
  return;
}

Assistant:

void LodRenderer::removeDecoration(ChunkCoords::repr coords, unsigned int tileIndex, const sf::Drawable* drawable) {
    auto chunkDeco = decorations_.find(coords);
    auto deco = chunkDeco->second.find(tileIndex);
    if (deco->second != drawable) {
        // Do nothing if there is a different drawable at the selected coordinates.
        return;
    }
    chunkDeco->second.erase(deco);
    if (chunkDeco->second.empty()) {
        decorations_.erase(chunkDeco);
    }
}